

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O1

void Qentem::TestOutPut::
     Print<char_const*,char[2],unsigned_long,char[10],char_const*,char[9],char[20],char[19],Qentem::StringStream<char>,char[4]>
               (char **values,char (*values_1) [2],unsigned_long *values_2,char (*values_3) [10],
               char **values_4,char (*values_5) [9],char (*values_6) [20],char (*values_7) [19],
               StringStream<char> *values_8,char (*values_9) [4])

{
  wostream *pwVar1;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  
  if (GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar1 = (wostream *)&std::wcout;
  }
  else {
    pwVar1 = (wostream *)(GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  }
  pwVar1 = std::operator<<(pwVar1,*values);
  pwVar1 = std::operator<<(pwVar1,*values_1);
  pwVar1 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar1);
  pwVar1 = std::operator<<(pwVar1,*values_3);
  pwVar1 = std::operator<<(pwVar1,*values_4);
  pwVar1 = std::operator<<(pwVar1,*values_5);
  pwVar1 = std::operator<<(pwVar1,*values_6);
  pwVar1 = std::operator<<(pwVar1,*values_7);
  pbVar2 = operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)pwVar1,values_8);
  std::operator<<((wostream *)pbVar2,*values_9);
  return;
}

Assistant:

inline static void Print(const Values_T &...values) {
        if (GetStreamCache() == nullptr) {
#if __cplusplus > 201402L
            (std::wcout << ... << values);
#else
            const int dummy[sizeof...(Values_T)] = {(std::wcout << values, 0)...};
            (void)dummy;
#endif

        } else {
#if __cplusplus > 201402L
            ((*GetStreamCache()) << ... << values);
#else
            const int dummy[sizeof...(Values_T)] = {((*GetStreamCache()) << values, 0)...};
            (void)dummy;
#endif
        }
    }